

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O1

void handle_internal_cmd(nh_cmd_desc **cmd,nh_cmd_arg *arg,int *count)

{
  int iVar1;
  nh_menuitem_conflict *pnVar2;
  size_t __size;
  uint uVar3;
  nh_bool nVar4;
  nh_direction nVar5;
  wchar_t wVar6;
  wchar_t listlen;
  nh_menuitem_conflict *pnVar7;
  char **namelist;
  char **desclist;
  nh_cmd_desc *pnVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  char *pcVar12;
  uint *puVar13;
  long lVar14;
  nh_menuitem *_item_;
  int iVar15;
  char cmdbuf [256];
  short local_238 [128];
  wchar_t local_138 [66];
  
  wVar6 = cmdcount;
  nVar5 = (*cmd)->flags & 0x1fffffff;
  switch(nVar5) {
  case DIR_W:
  case DIR_NW:
  case DIR_N:
  case DIR_NE:
  case DIR_E:
  case DIR_SE:
  case DIR_S:
  case DIR_SW:
  case DIR_UP:
  case DIR_DOWN:
    arg->argtype = 4;
    (arg->field_1).d = nVar5;
    uVar3 = (*cmd)->flags;
    if ((uVar3 >> 0x1d & 1) == 0) {
      if ((uVar3 >> 0x1e & 1) == 0) {
        if (-1 < (int)uVar3) {
          return;
        }
        pcVar12 = "go2";
      }
      else {
        pcVar12 = "run";
      }
    }
    else {
      pcVar12 = "move";
    }
    pnVar8 = find_command(pcVar12);
    *cmd = pnVar8;
    break;
  case DIR_SELF|DIR_NW:
    display_options('\0');
    goto switchD_0010a461_caseD_f;
  case DIR_UP|DIR_E:
    lVar14 = (long)cmdcount;
    if (lVar14 < 1) {
      iVar11 = 0;
    }
    else {
      lVar9 = 0;
      iVar11 = 0;
      do {
        iVar11 = iVar11 + (uint)((*(uint *)(commandlist->desc + lVar9 + 0x54) >> 10 & 1) != 0);
        lVar9 = lVar9 + 0x6c;
      } while (lVar14 * 0x6c - lVar9 != 0);
    }
    listlen = iVar11 + L'\x01';
    lVar9 = (long)iVar11;
    __size = lVar9 * 8 + 8;
    namelist = (char **)malloc(__size);
    desclist = (char **)malloc(__size);
    namelist[lVar9] = "?";
    desclist[lVar9] = "get this list of extended commands";
    if (L'\0' < wVar6) {
      iVar15 = 0;
      pnVar8 = commandlist;
      do {
        if ((pnVar8->flags & 0x400) != 0) {
          namelist[iVar15] = pnVar8->name;
          desclist[iVar15] = pnVar8->desc;
          iVar15 = iVar15 + 1;
        }
        pnVar8 = pnVar8 + 1;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    pnVar8 = (nh_cmd_desc *)0x0;
    do {
      nVar4 = curses_get_ext_cmd((char *)local_238,namelist,desclist,listlen);
      if (nVar4 == '\0') break;
      if (local_238[0] == 0x3f) {
        pnVar7 = (nh_menuitem_conflict *)malloc((lVar9 + 1) * 0x10c);
        if (iVar11 < 0) {
          uVar10 = 0;
        }
        else {
          lVar14 = 0x10a;
          uVar10 = 0;
          wVar6 = listlen;
          do {
            sprintf((char *)local_138," %s\t- %s.",namelist[uVar10]);
            if ((long)wVar6 <= (long)uVar10) {
              wVar6 = wVar6 * 2;
              pnVar7 = (nh_menuitem_conflict *)realloc(pnVar7,(long)wVar6 * 0x10c);
            }
            pcVar12 = pnVar7->caption + lVar14 + -8;
            *(undefined8 *)(pcVar12 + -0x10a) = 0;
            *(undefined2 *)(pcVar12 + -2) = MI_TEXT >> 0x10;
            *pcVar12 = '\0';
            strcpy(pcVar12 + -0x102,(char *)local_138);
            uVar10 = uVar10 + 1;
            lVar14 = lVar14 + 0x10c;
          } while ((uint)listlen != uVar10);
        }
        curses_display_menu(pnVar7,(wchar_t)uVar10,"Extended Commands List",L'\0',(wchar_t *)0x0);
      }
      else {
        pnVar8 = find_command((char *)local_238);
        if ((pnVar8 == (nh_cmd_desc *)0x0) || ((int)pnVar8->flags < 0)) {
          sprintf((char *)local_138,"%s: unknown extended command.",local_238);
          curses_msgwin((char *)local_138);
          pnVar8 = (nh_cmd_desc *)0x0;
        }
      }
    } while (pnVar8 == (nh_cmd_desc *)0x0);
    free(namelist);
    free(desclist);
    *cmd = pnVar8;
    break;
  case DIR_UP|DIR_SE:
    arg->argtype = 2;
    pnVar7 = (nh_menuitem_conflict *)malloc(0xa78);
    pnVar7->id = L'\x01';
    pnVar7->role = MI_NORMAL;
    pnVar7->accel = '\0';
    pnVar7->group_accel = '\0';
    pnVar7->selected = '\0';
    builtin_strncpy(pnVar7->caption,"describe game commands",0x17);
    pnVar7[1].id = L'\x02';
    pnVar7[1].role = MI_NORMAL;
    pnVar7[1].accel = '\0';
    pnVar7[1].group_accel = '\0';
    pnVar7[1].selected = '\0';
    pnVar7[1].caption[0] = 'd';
    pnVar7[1].caption[1] = 'e';
    pnVar7[1].caption[2] = 's';
    pnVar7[1].caption[3] = 'c';
    pnVar7[1].caption[4] = 'r';
    pnVar7[1].caption[5] = 'i';
    pnVar7[1].caption[6] = 'b';
    pnVar7[1].caption[7] = 'e';
    pnVar7[1].caption[8] = ' ';
    pnVar7[1].caption[9] = 'w';
    pnVar7[1].caption[10] = 'h';
    pnVar7[1].caption[0xb] = 'a';
    pnVar7[1].caption[0xc] = 't';
    pnVar7[1].caption[0xd] = ' ';
    pnVar7[1].caption[0xe] = 'a';
    pnVar7[1].caption[0xf] = ' ';
    pnVar7[1].caption[9] = 'w';
    pnVar7[1].caption[10] = 'h';
    pnVar7[1].caption[0xb] = 'a';
    pnVar7[1].caption[0xc] = 't';
    pnVar7[1].caption[0xd] = ' ';
    pnVar7[1].caption[0xe] = 'a';
    pnVar7[1].caption[0xf] = ' ';
    pnVar7[1].caption[0x10] = 'k';
    pnVar7[1].caption[0x11] = 'e';
    pnVar7[1].caption[0x12] = 'y';
    pnVar7[1].caption[0x13] = ' ';
    pnVar7[1].caption[0x14] = 'd';
    pnVar7[1].caption[0x15] = 'o';
    pnVar7[1].caption[0x16] = 'e';
    pnVar7[1].caption[0x17] = 's';
    pnVar7[1].caption[0x18] = '\0';
    pnVar7[2].id = L'\x03';
    pnVar7[2].role = MI_NORMAL;
    pnVar7[2].accel = '\0';
    pnVar7[2].group_accel = '\0';
    pnVar7[2].selected = '\0';
    pnVar7[2].caption[0x10] = '\0';
    pnVar7[2].caption[0] = 'd';
    pnVar7[2].caption[1] = 'e';
    pnVar7[2].caption[2] = 's';
    pnVar7[2].caption[3] = 'c';
    pnVar7[2].caption[4] = 'r';
    pnVar7[2].caption[5] = 'i';
    pnVar7[2].caption[6] = 'b';
    pnVar7[2].caption[7] = 'e';
    pnVar7[2].caption[8] = ' ';
    pnVar7[2].caption[9] = 'o';
    pnVar7[2].caption[10] = 'p';
    pnVar7[2].caption[0xb] = 't';
    pnVar7[2].caption[0xc] = 'i';
    pnVar7[2].caption[0xd] = 'o';
    pnVar7[2].caption[0xe] = 'n';
    pnVar7[2].caption[0xf] = 's';
    if (cmdcount < L'\x01') {
      iVar11 = 10;
      iVar15 = 3;
    }
    else {
      puVar13 = &commandlist->flags;
      iVar15 = 3;
      iVar11 = 10;
      lVar14 = 0;
      do {
        if ((*puVar13 & 0x1000) != 0) {
          if (iVar11 <= iVar15) {
            iVar11 = iVar11 * 2;
            pnVar7 = (nh_menuitem_conflict *)realloc(pnVar7,(long)iVar11 * 0x10c);
          }
          pnVar2 = pnVar7 + iVar15;
          pnVar2->id = (int)lVar14 + L'd';
          pnVar2->role = MI_NORMAL;
          pnVar2->accel = '\0';
          pnVar2->group_accel = '\0';
          pnVar2->selected = '\0';
          strcpy(pnVar2->caption,(char *)(puVar13 + -0x15));
          iVar15 = iVar15 + 1;
        }
        lVar14 = lVar14 + 1;
        puVar13 = puVar13 + 0x1b;
      } while (lVar14 < cmdcount);
    }
    if (iVar11 <= iVar15) {
      iVar11 = iVar11 * 2;
      pnVar7 = (nh_menuitem_conflict *)realloc(pnVar7,(long)iVar11 * 0x10c);
    }
    pnVar7[iVar15].id = L'\0';
    pnVar7[iVar15].role = MI_NORMAL;
    pnVar7[iVar15].accel = '\0';
    pnVar7[iVar15].group_accel = '\0';
    pnVar7[iVar15].selected = '\0';
    pnVar7[iVar15].caption[0] = '\0';
    iVar1 = iVar15 + 1;
    if (iVar11 <= iVar1) {
      pnVar7 = (nh_menuitem_conflict *)realloc(pnVar7,(long)(iVar11 * 2) * 0x10c);
    }
    pnVar7[iVar1].id = L'\x04';
    pnVar7[iVar1].role = MI_NORMAL;
    pnVar7[iVar1].accel = '?';
    pnVar7[iVar1].group_accel = '\0';
    pnVar7[iVar1].selected = '\0';
    builtin_strncpy(pnVar7[iVar1].caption,"show quick refer",0x10);
    builtin_strncpy(pnVar7[iVar1].caption + 0xd,"ference",8);
    wVar6 = curses_display_menu(pnVar7,iVar15 + L'\x02',"Help topics:",L'\x01',local_138);
    free(pnVar7);
    if (wVar6 < L'\x01') goto LAB_0010a9f5;
    switch(local_138[0]) {
    case L'\x01':
      show_keymap_menu('\x01');
      break;
    case L'\x02':
      show_whatdoes();
      break;
    case L'\x03':
      print_options();
      break;
    case L'\x04':
      pnVar8 = (nh_cmd_desc *)0x0;
      curses_display_menu((nh_menuitem_conflict *)&show_quickref_refitems,L'Z',"Quick reference:",
                          L'\0',(wchar_t *)0x0);
      goto LAB_0010a9f7;
    default:
      pnVar8 = (nh_cmd_desc *)0x0;
      if ((L'c' < local_138[0]) && (local_138[0] + L'\xffffff9c' < cmdcount)) {
        pnVar8 = commandlist + (uint)(local_138[0] + L'\xffffff9c');
      }
      goto LAB_0010a9f7;
    }
LAB_0010a9f5:
    pnVar8 = (nh_cmd_desc *)0x0;
LAB_0010a9f7:
    *cmd = pnVar8;
    break;
  case DIR_UP|DIR_S:
    *cmd = prev_cmd;
    *arg = prev_arg;
    *count = prev_count;
    break;
  case DIR_UP|DIR_SW:
  case 0x12:
    goto switchD_0010a461_caseD_f;
  case 0x10:
    doprev_message();
    goto switchD_0010a461_caseD_f;
  case 0x11:
    show_whatdoes();
switchD_0010a461_caseD_f:
    *cmd = (nh_cmd_desc *)0x0;
  }
  return;
}

Assistant:

void handle_internal_cmd(struct nh_cmd_desc **cmd, struct nh_cmd_arg *arg, int *count)
{
    int id = (*cmd)->flags & ~(CMD_UI | DIRCMD | DIRCMD_SHIFT | DIRCMD_CTRL);
    switch (id) {
	case DIR_NW: case DIR_N: case DIR_NE:
	case DIR_E:              case DIR_W:
	case DIR_SW: case DIR_S: case DIR_SE:
	case DIR_UP: case DIR_DOWN:
	    arg->argtype = CMD_ARG_DIR;
	    arg->d = id;
	    if ((*cmd)->flags & DIRCMD)
		*cmd = find_command("move");
	    else if((*cmd)->flags & DIRCMD_SHIFT)
		*cmd = find_command("run");
	    else if((*cmd)->flags & DIRCMD_CTRL)
		*cmd = find_command("go2");
	    break;

	case UICMD_OPTIONS:
	    display_options(FALSE);
	    *cmd = NULL;
	    break;

	case UICMD_EXTCMD:
	    *cmd = doextcmd();
	    break;

	case UICMD_HELP:
	    arg->argtype = CMD_ARG_NONE;
	    *cmd = show_help();
	    break;

	case UICMD_REDO:
	    *cmd = prev_cmd;
	    *arg = prev_arg;
	    *count = prev_count;
	    break;

	case UICMD_REPEATPREFIX:
	    *cmd = NULL;
	    break;

	case UICMD_PREVMSG:
	    doprev_message();
	    *cmd = NULL;
	    break;

	case UICMD_WHATDOES:
	    show_whatdoes();
	    *cmd = NULL;
	    break;

	case UICMD_NOTHING:
	    *cmd = NULL;
	    break;
    }
}